

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O0

void __thiscall
TPZVec<std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>_>::~TPZVec
          (TPZVec<std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>_> *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__TPZVec_024bb498;
  if ((in_RDI[1] != 0) && (lVar1 = in_RDI[1], lVar1 != 0)) {
    lVar2 = *(long *)(lVar1 + -8);
    for (lVar3 = lVar1 + lVar2 * 0x20; lVar1 != lVar3; lVar3 = lVar3 + -0x20) {
      std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>::~function
                ((function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *)0x19ed490);
    }
    operator_delete__((void *)(lVar1 + -8),lVar2 * 0x20 + 8);
  }
  return;
}

Assistant:

inline TPZVec<T>::~TPZVec() {
	if( fStore )
	{
		delete [] fStore;
	}
}